

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_filter.hpp
# Opt level: O3

void MeanField::Filtering::applyGaussianKernel
               (float *kernel,float *input,float *output,float sd,int dim,int x,int y,int W,int H)

{
  float fVar1;
  float fVar2;
  int iVar3;
  void *__s;
  float *pfVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  float *pfVar10;
  ulong uVar11;
  long lVar12;
  float fVar13;
  
  uVar11 = (ulong)(uint)dim;
  uVar9 = 0xffffffffffffffff;
  if (-1 < dim) {
    uVar9 = uVar11 * 4;
  }
  __s = operator_new__(uVar9);
  if (0 < dim) {
    memset(__s,0,uVar11 * 4);
  }
  iVar3 = (int)sd;
  if (0 < iVar3) {
    lVar5 = (long)dim;
    lVar6 = (long)W;
    pfVar4 = input + ((((long)y - (long)iVar3) * lVar6 + (long)x) - (long)iVar3) * lVar5;
    fVar13 = 0.0;
    lVar12 = (long)-iVar3;
    do {
      lVar7 = lVar12 + y;
      if (lVar7 < H && -1 < lVar7) {
        lVar7 = (long)-iVar3;
        pfVar10 = pfVar4;
        do {
          lVar8 = lVar7 + x;
          if (lVar8 < lVar6 && -1 < lVar8) {
            fVar1 = kernel[(int)ABS((float)(int)lVar12)];
            fVar2 = kernel[(int)ABS((float)(int)lVar7)];
            fVar13 = fVar13 + fVar1 * fVar2;
            if (0 < dim) {
              uVar9 = 0;
              do {
                *(float *)((long)__s + uVar9 * 4) =
                     pfVar10[uVar9] * fVar1 * fVar2 + *(float *)((long)__s + uVar9 * 4);
                uVar9 = uVar9 + 1;
              } while (uVar11 != uVar9);
            }
          }
          lVar7 = lVar7 + 1;
          pfVar10 = pfVar10 + lVar5;
        } while ((int)lVar7 != iVar3);
      }
      lVar12 = lVar12 + 1;
      pfVar4 = pfVar4 + lVar6 * lVar5;
    } while ((int)lVar12 != iVar3);
    if (0.0 < fVar13 && 0 < dim) {
      uVar9 = 0;
      do {
        output[(long)((W * y + x) * dim) + uVar9] = *(float *)((long)__s + uVar9 * 4) / fVar13;
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
    }
  }
  operator_delete__(__s);
  return;
}

Assistant:

__SHARED_CODE__
            inline void applyGaussianKernel(const float *kernel, const float *input, float *output,
                float sd, int dim, int x, int y, int W, int H) {
            float normaliser = 0.0;
            float factor;
            float *channelSum = new float[dim];
            for (int i = 0; i < dim; i++) {
                channelSum[i] = 0.0;
            }

            int sd_int = (int)sd;
            int idx_x, idx_y;
            //Convolve for each channel.
            for (int i = -sd_int; i < sd_int; i++) {
                idx_y = y + i;
                if (idx_y < 0 || idx_y >= H) {
                    continue;
                }

                for (int j = -sd_int; j < sd_int; j++) {
                    idx_x = x + j;
                    if (idx_x < 0 || idx_x >= W) {
                        continue;
                    }
                    factor = kernel[(int)fabs((float)i)] * kernel[(int)fabs((float)j)];
                    normaliser += factor;

                    //Update cumulative output for each dimension/channel.
                    for (int k = 0; k < dim; k++) {
                        channelSum[k] += input[(idx_y*W + idx_x)*dim + k] * factor;
                    }
                }
            }

            //Normalise outputs.
            if (normaliser > 0.0) {
                for (int i = 0; i < dim; i++) {
                    output[(y*W + x)*dim + i] = channelSum[i] / normaliser;
                }
            }
            delete[] channelSum;
        }